

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime.c
# Opt level: O3

int week_calc(tm *timeptr,int wtype)

{
  int iVar1;
  uint uVar2;
  div_t dVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  if (wtype < 2) {
    dVar3 = div(timeptr->tm_yday,7);
    iVar1 = timeptr->tm_wday - wtype;
    iVar6 = (int)((ulong)((long)(iVar1 + 7) * -0x6db6db6d) >> 0x20) + iVar1 + 7;
    return (uint)(((iVar6 >> 2) - (iVar6 >> 0x1f)) * -7 + iVar1 + 7 <= dVar3.rem) + dVar3.quot;
  }
  iVar1 = timeptr->tm_wday;
  iVar6 = timeptr->tm_yday;
  iVar4 = 7;
  if (iVar1 != 0) {
    iVar4 = iVar1;
  }
  iVar7 = iVar6 - iVar4;
  if ((iVar6 - iVar4) - 0x168U < 7) {
    iVar1 = _PDCLIB_is_leap(timeptr->tm_year);
    uVar2 = 0x35;
    if (0x168 < iVar7 - iVar1) {
      uVar2 = 1;
    }
LAB_00103b04:
    if (wtype == 2) {
      return uVar2;
    }
    if ((int)uVar2 < 0x34) {
      uVar5 = 0;
      if (uVar2 == 1) {
        uVar5 = (uint)(timeptr->tm_mon == 0xb);
      }
      goto LAB_00103b28;
    }
  }
  else {
    if (0xc < iVar7 + 0x11U) {
      iVar1 = (int)((ulong)((long)(iVar7 + 0xb) * -0x6db6db6d) >> 0x20) + iVar7 + 0xb;
      uVar2 = (iVar1 >> 2) - (iVar1 >> 0x1f);
      goto LAB_00103b04;
    }
    iVar6 = (iVar6 / 7) * 7 - iVar6;
    iVar4 = iVar1 + iVar6;
    iVar1 = iVar1 + 7 + iVar6;
    if (-1 < iVar4) {
      iVar1 = iVar4;
    }
    if (iVar1 != 5) {
      iVar6 = _PDCLIB_is_leap(timeptr->tm_year + -1);
      uVar2 = (iVar1 == 6 && iVar6 != 0) | 0x34;
      goto LAB_00103b04;
    }
    if (wtype == 2) {
      return 0x35;
    }
  }
  uVar5 = -(uint)(timeptr->tm_mon == 0);
LAB_00103b28:
  return timeptr->tm_year + uVar5 + 0x76c;
}

Assistant:

static int week_calc( const struct tm * timeptr, int wtype )
{
    int wday;
    int bias;
    int week;

    if ( wtype <= E_MONDAY )
    {
        /* Simple -- first week starting with E_SUNDAY / E_MONDAY,
           days before that are week 0.
        */
        div_t weeks = div( timeptr->tm_yday, 7 );
        wday = ( timeptr->tm_wday + 7 - wtype ) % 7;

        if ( weeks.rem >= wday )
        {
            ++weeks.quot;
        }

        return weeks.quot;
    }

    /* calculating ISO week; relies on Sunday == 7 */
    wday = timeptr->tm_wday;

    if ( wday == 0 )
    {
        wday = 7;
    }

    /* https://en.wikipedia.org/wiki/ISO_week_date */
    week = ( timeptr->tm_yday - wday + 11 ) / 7;

    if ( week == 53 )
    {
        /* date *may* belong to the *next* year, if:
           * it is 31.12. and Monday - Wednesday
           * it is 30.12. and Monday - Tuesday
           * it is 29.12. and Monday
           We can safely assume December...
        */
        if ( ( timeptr->tm_yday - wday - _PDCLIB_is_leap( timeptr->tm_year ) ) > 360 )
        {
            week = 1;
        }
    }
    else if ( week == 0 )
    {
        /* date *does* belong to *previous* year,
           i.e. has week 52 *unless*...
           * current year started on a Friday, or
           * previous year is leap and this year
             started on a Saturday.
        */
        int firstday = timeptr->tm_wday - ( timeptr->tm_yday % 7 );

        if ( firstday < 0 )
        {
            firstday += 7;
        }

        if ( ( firstday == 5 ) || ( _PDCLIB_is_leap( timeptr->tm_year - 1 ) && firstday == 6 ) )
        {
            week = 53;
        }
        else
        {
            week = 52;
        }
    }

    if ( wtype == E_ISO_WEEK )
    {
        return week;
    }

    /* E_ISO_YEAR -- determine the "week-based year" */
    bias = 0;

    if ( week >= 52 && timeptr->tm_mon == 0 )
    {
        --bias;
    }
    else if ( week == 1 && timeptr->tm_mon == 11 )
    {
        ++bias;
    }

    return timeptr->tm_year + 1900 + bias;
}